

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

size_t __thiscall
Diligent::ShaderCodeVariableDescX::AddMember
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDesc *Member)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  
  pSVar1 = (this->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>::
  emplace_back<Diligent::ShaderCodeVariableDesc_const&>
            ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
              *)&this->Members,Member);
  pSVar3 = (this->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_ShaderCodeVariableDesc).NumMembers =
       (Uint32)((ulong)((long)(this->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 7);
  (this->super_ShaderCodeVariableDesc).pMembers = &pSVar3->super_ShaderCodeVariableDesc;
  return (long)pSVar1 - (long)pSVar2 >> 7;
}

Assistant:

size_t AddMember(const ShaderCodeVariableDesc& Member)
    {
        const auto idx = Members.size();
        Members.emplace_back(Member);
        NumMembers = static_cast<Uint32>(Members.size());
        pMembers   = Members.data();
        return idx;
    }